

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void printCCOperand(MCInst *MI,int opNum,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  int64_t iVar2;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  int CC;
  char *in_stack_ffffffffffffffc8;
  sparc_cc local_24;
  sparc_cc local_1c;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar2 = MCOperand_getImm(op);
  local_24 = (int)iVar2 + SPARC_CC_ICC_N;
  uVar1 = MCInst_getOpcode(in_RDI);
  if ((((uVar1 - 0x4f < 4) || (uVar1 - 0x97 < 2)) || (uVar1 == 0xba)) ||
     (((uVar1 == 0xbe || (uVar1 == 0xd4)) ||
      ((uVar1 - 0x148 < 2 || (local_1c = local_24, uVar1 - 0x1da < 5)))))) {
    if ((int)local_24 < 0x110) {
      local_24 = (int)iVar2 + SPARC_CC_FCC_N;
    }
    local_1c = local_24;
  }
  SPARCCondCodeToString(local_1c);
  SStream_concat0(in_RDX,in_stack_ffffffffffffffc8);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    (in_RDI->flat_insn->detail->field_6).sparc.cc = local_1c;
  }
  return;
}

Assistant:

static void printCCOperand(MCInst *MI, int opNum, SStream *O)
{
	int CC = (int)MCOperand_getImm(MCInst_getOperand(MI, opNum)) + 256;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case SP_FBCOND:
		case SP_FBCONDA:
		case SP_BPFCC:
		case SP_BPFCCA:
		case SP_BPFCCNT:
		case SP_BPFCCANT:
		case SP_MOVFCCrr:  case SP_V9MOVFCCrr:
		case SP_MOVFCCri:  case SP_V9MOVFCCri:
		case SP_FMOVS_FCC: case SP_V9FMOVS_FCC:
		case SP_FMOVD_FCC: case SP_V9FMOVD_FCC:
		case SP_FMOVQ_FCC: case SP_V9FMOVQ_FCC:
				 // Make sure CC is a fp conditional flag.
				 CC = (CC < 16+256) ? (CC + 16) : CC;
				 break;
	}

	SStream_concat0(O, SPARCCondCodeToString((sparc_cc)CC));

	if (MI->csh->detail)
		MI->flat_insn->detail->sparc.cc = (sparc_cc)CC;
}